

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void decode_block(AV1Decoder *pbi,ThreadData *td,int mi_row,int mi_col,aom_reader *r,
                 PARTITION_TYPE partition,BLOCK_SIZE bsize)

{
  ThreadData *in_stack_00000028;
  undefined7 in_stack_00000031;
  BLOCK_SIZE in_stack_000000e7;
  aom_reader *in_stack_000000e8;
  ThreadData *in_stack_000000f0;
  AV1Decoder *in_stack_000000f8;
  
  set_offsets_for_pred_and_recon
            ((AV1Decoder *)CONCAT71(in_stack_00000031,bsize),in_stack_00000028,pbi._4_4_,(int)pbi,
             td._7_1_);
  decode_token_recon_block(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e7);
  return;
}

Assistant:

static inline void decode_block(AV1Decoder *const pbi, ThreadData *const td,
                                int mi_row, int mi_col, aom_reader *r,
                                PARTITION_TYPE partition, BLOCK_SIZE bsize) {
  (void)partition;
  set_offsets_for_pred_and_recon(pbi, td, mi_row, mi_col, bsize);
  decode_token_recon_block(pbi, td, r, bsize);
}